

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::siblings_expansion
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Siblings *siblings,int k
          )

{
  Dictionary_it s_h;
  Dictionary_it next;
  Dictionary_it local_38;
  Dictionary_it local_30;
  
  if ((-1 < k) && (k < this->dimension_)) {
    this->dimension_ = k;
  }
  if (k != 0) {
    local_30.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)(siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    if (local_30.m_ptr ==
        (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
         *)0x0) {
LAB_0013f1ea:
      __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                    "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, false>::operator++() [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, IsConst = false]"
                   );
    }
    if (local_30.m_ptr !=
        (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
         *)((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
           (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
      local_38.m_ptr = local_30.m_ptr;
      do {
        local_30.m_ptr = local_30.m_ptr + 1;
        create_expansion<false>
                  (this,siblings,&local_38,&local_30,(Filtration_value *)&(local_38.m_ptr)->second,k
                   ,(vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                     *)0x0);
        if (local_38.m_ptr ==
            (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
             *)0x0) goto LAB_0013f1ea;
        local_38.m_ptr = local_38.m_ptr + 1;
        if (local_30.m_ptr ==
            (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
             *)0x0) goto LAB_0013f1ea;
      } while (local_38.m_ptr !=
               (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                *)((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                  (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size));
    }
  }
  return;
}

Assistant:

void siblings_expansion(Siblings * siblings,  // must contain elements
                          int k) {
    if (k >= 0 && dimension_ > k) {
      dimension_ = k;
    }
    if (k == 0)
      return;
    Dictionary_it next = siblings->members().begin();
    ++next;

    for (Dictionary_it s_h = siblings->members().begin();
         s_h != siblings->members().end(); ++s_h, ++next)
    {
      create_expansion<false>(siblings, s_h, next, s_h->second.filtration(), k);
    }
  }